

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::sessionFixtureLogOn_TimeoutWaitingForLogOnResponseHelper::RunImpl
          (sessionFixtureLogOn_TimeoutWaitingForLogOnResponseHelper *this)

{
  _func_int **pp_Var1;
  TestResults *this_00;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  UtcTimeStamp time;
  Logon local_2d0;
  Message sentLogon;
  int local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&sentLogon,8,8,8,0xd,5,0x7df);
  *(ulong *)&(this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.m_date =
       CONCAT44(uStack_16c,local_170);
  (this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.m_time =
       CONCAT44(uStack_164,uStack_168);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&sentLogon,0x10,0x10,0x10,0xd,5,0x898);
  (this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_date = local_170;
  *(undefined4 *)
   &(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.field_0xc =
       uStack_16c;
  *(undefined4 *)&(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_time
       = uStack_168;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_time + 4) =
       uStack_164;
  (this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.m_date = 0;
  pp_Var1 = (this->super_sessionFixture).super_TestCallback.super_Responder._vptr_Responder;
  *(undefined8 *)&(this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.field_0xc
       = *(undefined8 *)
          &(this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.m_time
        + 4);
  (this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.m_date = 0;
  *(undefined8 *)&(this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.field_0xc =
       *(undefined8 *)
        &(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_time +
        4);
  (*pp_Var1[8])(this,1,0,0x1f);
  *(undefined4 *)((this->super_sessionFixture).object + 0x268) = 0;
  FIX::UtcTimeStamp::UtcTimeStamp(&time);
  createLogon(&local_2d0,"TW","ISLD",1);
  FIX::Message::Message(&sentLogon,(Message *)&local_2d0);
  FIX::Message::~Message((Message *)&local_2d0);
  FIX::Session::send((Message *)(this->super_sessionFixture).object);
  FIX::Session::next();
  FIX::Session::next();
  if ((this->super_sessionFixture).object[0x263] == (Session)0x1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)&local_2d0,*ppTVar3,0x741);
    UnitTest::TestResults::OnTestFailure(this_00,(TestDetails *)&local_2d0,"!object->sentLogon()");
  }
  FIX::Message::~Message(&sentLogon);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, LogOn_TimeoutWaitingForLogOnResponse) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);
  object->setLogonTimeout(0);

  UtcTimeStamp time;

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->next();

  CHECK(!object->sentLogon());
}